

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

ArgIface * __thiscall Args::Command::findChild(Command *this,String *name)

{
  Command *in_RSI;
  long in_RDI;
  String *unaff_retaddr;
  ArgIface *arg;
  ArgIface *local_8;
  
  local_8 = GroupIface::findArgument((GroupIface *)arg,unaff_retaddr);
  if ((local_8 == (ArgIface *)0x0) && (*(long *)(in_RDI + 0xe8) != 0)) {
    local_8 = findChild(in_RSI,(String *)0x0);
  }
  return local_8;
}

Assistant:

ArgIface * findChild(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name )
	{
		auto * arg = GroupIface::findArgument( name );

		if( !arg && m_subCommand )
			return m_subCommand->findChild( name );

		return arg;
	}